

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O1

light_pcapng light_read_from_memory(uint32_t *memory,size_t size)

{
  uint *__src;
  uint32_t uVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  _light_pcapng *p_Var5;
  uint32_t *puVar6;
  ulong *puVar7;
  _light_option *p_Var8;
  int32_t max_len;
  uint uVar9;
  ulong uVar10;
  light_pcapng p_Var11;
  uint32_t *local_68;
  ulong local_60;
  size_t local_58;
  light_pcapng local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_50 = (light_pcapng)0x0;
  p_Var11 = (light_pcapng)0x0;
  do {
    if (size < 0xd) {
      return local_50;
    }
    local_68 = memory;
    p_Var5 = (_light_pcapng *)calloc(1,0x20);
    if (p_Var11 == (light_pcapng)0x0) {
      if (p_Var5 != (light_pcapng)0x0) {
        if (local_50 == (light_pcapng)0x0) {
          local_50 = p_Var5;
        }
        goto LAB_001029d7;
      }
      light_read_from_memory_cold_3();
      bVar4 = false;
    }
    else {
      p_Var11->next_block = p_Var5;
      if (p_Var5 == (light_pcapng)0x0) {
        light_read_from_memory_cold_1();
        bVar4 = false;
        p_Var5 = p_Var11;
      }
      else {
        p_Var5 = p_Var11->next_block;
LAB_001029d7:
        p_Var5->block_type = *memory;
        __src = memory + 2;
        uVar9 = memory[1];
        p_Var5->block_total_lenght = uVar9;
        local_68 = __src;
        if ((uVar9 & 3) != 0) {
          light_read_from_memory_cold_2();
        }
        uVar1 = p_Var5->block_type;
        if ((int)uVar1 < 3) {
          if (uVar1 == 0xb16b00b5) {
            local_48 = CONCAT44(local_48._4_4_,memory[4]);
            uVar2 = *(ulong *)(memory + 2);
            local_58 = uVar2 & 0xffffffff;
            uVar10 = (ulong)(((uint)uVar2 & 0xfffffffc) + 4);
            if ((uVar2 & 3) == 0) {
              uVar10 = uVar2 & 0xffffffff;
            }
            local_68 = memory + 5;
            local_60 = size;
            puVar7 = (ulong *)calloc(1,uVar10 + 0xc);
            size = local_60;
            *puVar7 = uVar2;
            *(undefined4 *)(puVar7 + 1) = (undefined4)local_48;
            memcpy((void *)((long)puVar7 + 0xc),memory + 5,local_58);
            local_68 = (uint32_t *)((long)memory + (ulong)((uint)uVar10 & 0xfffffffc) + 0x14);
            p_Var5->block_body = (uint32_t *)puVar7;
            max_len = ((int)memory - (int)local_68) + p_Var5->block_total_lenght + -4;
          }
          else {
            if (uVar1 != 1) {
LAB_00102c92:
              uVar9 = p_Var5->block_total_lenght - 0xc;
              if (uVar9 == 0) {
                p_Var5->block_body = (uint32_t *)0x0;
              }
              else {
                puVar6 = (uint32_t *)calloc((ulong)uVar9,1);
                p_Var5->block_body = puVar6;
                memcpy(puVar6,__src,(ulong)uVar9);
                local_68 = (uint32_t *)((ulong)(uVar9 & 0xfffffffc) + (long)__src);
              }
              goto LAB_00102c5b;
            }
            puVar6 = (uint32_t *)calloc(1,8);
            *puVar6 = memory[2];
            local_68 = memory + 4;
            puVar6[1] = memory[3];
            p_Var5->block_body = puVar6;
            max_len = p_Var5->block_total_lenght - 0x14;
          }
LAB_00102c4d:
          p_Var8 = __parse_options(&local_68,max_len);
          p_Var5->options = p_Var8;
        }
        else if (uVar1 == 3) {
          uVar1 = memory[2];
          uVar9 = p_Var5->block_total_lenght - 0x10;
          local_68 = memory + 3;
          local_60 = size;
          puVar6 = (uint32_t *)calloc(1,(ulong)uVar9 + 0x14);
          *puVar6 = uVar1;
          memcpy(puVar6 + 1,memory + 3,(ulong)uVar9);
          local_68 = (uint32_t *)((long)memory + (ulong)(uVar9 & 0xfffffffc) + 0xc);
          p_Var5->block_body = puVar6;
          p_Var5->options = (_light_option *)0x0;
          size = local_60;
        }
        else {
          if (uVar1 != 6) {
            local_60 = size;
            if (uVar1 != 0xa0d0d0a) goto LAB_00102c92;
            puVar6 = (uint32_t *)calloc(1,0x10);
            *puVar6 = memory[2];
            puVar6[1] = memory[3];
            *(undefined8 *)(puVar6 + 2) = *(undefined8 *)(memory + 4);
            local_68 = memory + 6;
            p_Var5->block_body = puVar6;
            max_len = p_Var5->block_total_lenght - 0x1c;
            goto LAB_00102c4d;
          }
          local_58 = CONCAT44(local_58._4_4_,memory[6]);
          local_48 = *(undefined8 *)(memory + 2);
          uStack_40 = *(undefined8 *)(memory + 4);
          uVar9 = memory[5];
          uVar3 = (uVar9 & 0xfffffffc) + 4;
          if ((uVar9 & 3) == 0) {
            uVar3 = uVar9;
          }
          local_68 = memory + 7;
          local_60 = size;
          puVar6 = (uint32_t *)calloc(1,(ulong)uVar3 + 0x14);
          *(undefined8 *)puVar6 = local_48;
          *(undefined8 *)(puVar6 + 2) = uStack_40;
          puVar6[4] = (uint32_t)local_58;
          memcpy(puVar6 + 5,memory + 7,(ulong)uVar9);
          local_68 = (uint32_t *)((long)memory + (ulong)(uVar3 & 0xfffffffc) + 0x1c);
          p_Var5->block_body = puVar6;
          p_Var8 = __parse_options(&local_68,
                                   ((int)memory - (int)local_68) + p_Var5->block_total_lenght + -4);
          p_Var5->options = p_Var8;
          size = local_60;
        }
LAB_00102c5b:
        uVar9 = *local_68;
        if (uVar9 != p_Var5->block_total_lenght) {
          local_68 = local_68 + 1;
          fprintf(_stderr,"ERROR at %s::%s::%d: %d != %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
                  ,"__parse_mem_copy",0xf8,(ulong)uVar9,p_Var5->block_total_lenght);
        }
        size = size - p_Var5->block_total_lenght;
        memory = (uint32_t *)((long)memory + (ulong)(p_Var5->block_total_lenght & 0xfffffffc));
        bVar4 = true;
      }
    }
    p_Var11 = p_Var5;
    if (!bVar4) {
      return local_50;
    }
  } while( true );
}

Assistant:

light_pcapng light_read_from_memory(const uint32_t *memory, size_t size)
{
	struct _light_pcapng *head = NULL;
	__parse_mem_copy(&head, memory, size);
	return head;
}